

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxinfo.cpp
# Opt level: O2

void __thiscall ktxInfo::usage(ktxInfo *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_ktxApp).name);
  std::operator<<(poVar1,
                  " [options] [<infile> ...]\n\n  infile ...   The file or files about which to print information. If\n               not specified, stdin is read.\n\n  Note that ktxinfo prints using UTF-8 encoding. If your console is not\n  set for UTF-8 you will see incorrect characters in output of the file\n  identifier on each side of the \"KTX nn\".\n\n  Options are:\n\n"
                 );
  ktxApp::usage(&this->super_ktxApp);
  return;
}

Assistant:

void
ktxInfo::usage()
{
    cerr <<
        "Usage: " << name << " [options] [<infile> ...]\n"
        "\n"
        "  infile ...   The file or files about which to print information. If\n"
        "               not specified, stdin is read.\n"
        "\n"
        "  Note that ktxinfo prints using UTF-8 encoding. If your console is not\n"
        "  set for UTF-8 you will see incorrect characters in output of the file\n"
        "  identifier on each side of the \"KTX nn\".\n"
        "\n"
        "  Options are:\n\n";
        ktxApp::usage();
}